

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

int Kit_DsdShrink_rec(Kit_DsdNtk_t *pNew,Kit_DsdNtk_t *p,int iLit,int *pPrios)

{
  ushort uVar1;
  ushort uVar2;
  Kit_DsdObj_t KVar3;
  uint uVar4;
  int iVar5;
  Kit_DsdObj_t *pKVar6;
  uint *puVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint *pTruth;
  uint uVar11;
  Kit_DsdObj_t *pKVar12;
  bool bVar13;
  uint uSupps [16];
  uint piLitsNew [16];
  uint local_b8 [16];
  uint local_78 [18];
  
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10c,"int Abc_Lit2Var(int)");
  }
  uVar4 = (uint)iLit >> 1;
  uVar1 = p->nVars;
  uVar10 = (ulong)uVar1;
  uVar11 = (uint)p->nNodes + (uint)uVar1;
  if (uVar11 <= uVar4) {
    __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kit.h"
                  ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
  }
  if (uVar4 < uVar1) {
    pKVar12 = (Kit_DsdObj_t *)0x0;
  }
  else {
    pKVar12 = p->pNodes[uVar4 - uVar10];
  }
  if (pKVar12 != (Kit_DsdObj_t *)0x0) {
    KVar3 = *pKVar12;
    uVar4 = (uint)KVar3 >> 6 & 7;
    if (uVar4 == 3) {
      if (0x3ffffff < (uint)KVar3) {
        uVar9 = 0;
        do {
          uVar2 = *(ushort *)((long)&pKVar12[1].field_0x0 + uVar9 * 2) >> 1;
          if (uVar11 <= uVar2) goto LAB_005330f6;
          if (p->pSupps == (uint *)0x0) {
            uVar4 = 0;
          }
          else if (uVar2 < uVar1) {
            uVar4 = 1 << ((byte)uVar2 & 0x1f);
          }
          else {
            uVar4 = p->pSupps[(uint)uVar2 - uVar10];
          }
          local_b8[uVar9] = uVar4;
          uVar9 = uVar9 + 1;
        } while ((uint)KVar3 >> 0x1a != uVar9);
      }
      Kit_DsdCompSort(pPrios,local_b8,(unsigned_short *)(pKVar12 + 1),(uint)KVar3 >> 0x1a,local_78);
      uVar4 = Kit_DsdShrink_rec(pNew,p,local_78[0],pPrios);
      uVar10 = 1;
      do {
        pKVar6 = Kit_DsdObjAlloc(pNew,KIT_DSD_AND,2);
        iVar5 = Kit_DsdShrink_rec(pNew,p,local_78[uVar10],pPrios);
        *(short *)(pKVar6 + 1) = (short)iVar5;
        *(short *)&pKVar6[1].field_0x2 = (short)uVar4;
        uVar4 = (int)*pKVar6 * 2 & 0x7e;
        uVar10 = uVar10 + 1;
      } while (uVar10 < (uint)*pKVar12 >> 0x1a);
    }
    else {
      if (uVar4 == 5) {
        pKVar6 = Kit_DsdObjAlloc(pNew,KIT_DSD_PRIME,(uint)KVar3 >> 0x1a);
        KVar3 = *pKVar12;
        puVar7 = (uint *)((long)&pKVar12[1].field_0x0 + (ulong)((uint)KVar3 >> 8 & 0x3fc));
        if (((uint)KVar3 & 0x1c0) != 0x140) {
          puVar7 = (uint *)0x0;
        }
        pTruth = (uint *)(&pKVar6[1].field_0x0 + ((uint)*pKVar6 >> 8 & 0x3fc));
        if (((uint)*pKVar6 & 0x1c0) != 0x140) {
          pTruth = (uint *)0x0;
        }
        uVar4 = 1 << ((KVar3._3_1_ >> 2) - 5 & 0x1f);
        if ((uint)KVar3 < 0x18000000) {
          uVar4 = 1;
        }
        if (0 < (int)uVar4) {
          lVar8 = (ulong)uVar4 + 1;
          do {
            pTruth[lVar8 + -2] = puVar7[lVar8 + -2];
            lVar8 = lVar8 + -1;
          } while (1 < lVar8);
        }
        if ((uint)*pKVar12 < 0x4000000) {
          uVar9 = (ulong)((uint)*pKVar12 >> 0x1a);
          bVar13 = true;
        }
        else {
          uVar10 = 0;
          do {
            uVar4 = Kit_DsdShrink_rec(pNew,p,(uint)*(ushort *)
                                                    ((long)&pKVar12[1].field_0x0 + uVar10 * 2),
                                      pPrios);
            *(ushort *)(&pKVar6[1].field_0x0 + uVar10 * 2) = (ushort)uVar4;
            if ((uVar4 & 1) != 0) {
              *(ushort *)(&pKVar6[1].field_0x0 + uVar10 * 2) = (ushort)uVar4 & 0xfffe;
              Kit_TruthChangePhase(pTruth,(uint)*pKVar6 >> 0x1a,(int)uVar10);
            }
            uVar10 = uVar10 + 1;
            uVar9 = (ulong)((uint)*pKVar12 >> 0x1a);
          } while (uVar10 < uVar9);
          bVar13 = (uint)*pKVar12 < 0x18000000;
        }
        if ((iLit & 1U) != 0) {
          uVar4 = 1 << ((char)uVar9 - 5U & 0x1f);
          if (bVar13) {
            uVar4 = 1;
          }
          if (0 < (int)uVar4) {
            lVar8 = (ulong)uVar4 + 1;
            do {
              pTruth[lVar8 + -2] = ~pTruth[lVar8 + -2];
              lVar8 = lVar8 + -1;
            } while (1 < lVar8);
          }
        }
        return (int)*pKVar6 * 2 & 0x7e;
      }
      if (uVar4 != 4) {
        __assert_fail("pObj->Type == KIT_DSD_PRIME",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kitDsd.c"
                      ,0x63d,"int Kit_DsdShrink_rec(Kit_DsdNtk_t *, Kit_DsdNtk_t *, int, int *)");
      }
      if (0x3ffffff < (uint)KVar3) {
        uVar9 = 0;
        do {
          uVar2 = *(ushort *)((long)&pKVar12[1].field_0x0 + uVar9 * 2);
          if ((uVar2 & 1) != 0) {
            __assert_fail("!Abc_LitIsCompl(iLitFanin)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kitDsd.c"
                          ,0x62c,"int Kit_DsdShrink_rec(Kit_DsdNtk_t *, Kit_DsdNtk_t *, int, int *)"
                         );
          }
          uVar2 = uVar2 >> 1;
          uVar4 = (uint)uVar2;
          if (uVar11 <= uVar4) {
LAB_005330f6:
            __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kit.h"
                          ,0x9c,"unsigned int Kit_DsdLitSupport(Kit_DsdNtk_t *, int)");
          }
          if (p->pSupps == (uint *)0x0) {
            uVar4 = 0;
          }
          else if (uVar4 < uVar1) {
            uVar4 = 1 << ((byte)uVar2 & 0x1f);
          }
          else {
            uVar4 = p->pSupps[uVar4 - uVar10];
          }
          local_b8[uVar9] = uVar4;
          uVar9 = uVar9 + 1;
        } while ((uint)KVar3 >> 0x1a != uVar9);
      }
      Kit_DsdCompSort(pPrios,local_b8,(unsigned_short *)(pKVar12 + 1),(uint)KVar3 >> 0x1a,local_78);
      uVar4 = Kit_DsdShrink_rec(pNew,p,local_78[0],pPrios);
      uVar10 = 1;
      do {
        pKVar6 = Kit_DsdObjAlloc(pNew,KIT_DSD_XOR,2);
        iVar5 = Kit_DsdShrink_rec(pNew,p,local_78[uVar10],pPrios);
        *(short *)(pKVar6 + 1) = (short)iVar5;
        *(short *)&pKVar6[1].field_0x2 = (short)uVar4;
        uVar4 = (int)*pKVar6 * 2 & 0x7e;
        uVar10 = uVar10 + 1;
      } while (uVar10 < (uint)*pKVar12 >> 0x1a);
    }
    iLit = (iLit & 1U) + ((uint)*pKVar6 & 0x3f) * 2;
  }
  return iLit;
}

Assistant:

int Kit_DsdShrink_rec( Kit_DsdNtk_t * pNew, Kit_DsdNtk_t * p, int iLit, int pPrios[] )
{
    Kit_DsdObj_t * pObj;
    Kit_DsdObj_t * pObjNew = NULL; // Suppress "might be used uninitialized"
    unsigned * pTruth, * pTruthNew;
    unsigned i, piLitsNew[16], uSupps[16];
    int iLitFanin, iLitNew;

    // consider the case of simple gate
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
        return iLit;
    if ( pObj->Type == KIT_DSD_AND )
    {
        // get the supports
        Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
            uSupps[i] = Kit_DsdLitSupport( p, iLitFanin );
        // put the largest component last
        // sort other components in the decreasing order of priority of their vars
        Kit_DsdCompSort( pPrios, uSupps, pObj->pFans, pObj->nFans, piLitsNew );
        // construct the two-input node network
        iLitNew = Kit_DsdShrink_rec( pNew, p, piLitsNew[0], pPrios );
        for ( i = 1; i < pObj->nFans; i++ )
        {
            pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_AND, 2 );
            pObjNew->pFans[0] = Kit_DsdShrink_rec( pNew, p, piLitsNew[i], pPrios );
            pObjNew->pFans[1] = iLitNew;
            iLitNew = Abc_Var2Lit( pObjNew->Id, 0 );
        }
        return Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(iLit) );
    }
    if ( pObj->Type == KIT_DSD_XOR )
    {
        // get the supports
        Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
        {
            assert( !Abc_LitIsCompl(iLitFanin) );
            uSupps[i] = Kit_DsdLitSupport( p, iLitFanin );
        }
        // put the largest component last
        // sort other components in the decreasing order of priority of their vars
        Kit_DsdCompSort( pPrios, uSupps, pObj->pFans, pObj->nFans, piLitsNew );
        // construct the two-input node network
        iLitNew = Kit_DsdShrink_rec( pNew, p, piLitsNew[0], pPrios );
        for ( i = 1; i < pObj->nFans; i++ )
        {
            pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_XOR, 2 );
            pObjNew->pFans[0] = Kit_DsdShrink_rec( pNew, p, piLitsNew[i], pPrios );
            pObjNew->pFans[1] = iLitNew;
            iLitNew = Abc_Var2Lit( pObjNew->Id, 0 );
        }
        return Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(iLit) );
    }
    assert( pObj->Type == KIT_DSD_PRIME );

    // create new PRIME node
    pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_PRIME, pObj->nFans );
    // copy the truth table
    pTruth = Kit_DsdObjTruth( pObj );
    pTruthNew = Kit_DsdObjTruth( pObjNew );
    Kit_TruthCopy( pTruthNew, pTruth, pObj->nFans );
    // create fanins
    Kit_DsdObjForEachFanin( pNtk, pObj, iLitFanin, i )
    {
        pObjNew->pFans[i] = Kit_DsdShrink_rec( pNew, p, iLitFanin, pPrios );
        // complement the corresponding inputs of the truth table
        if ( Abc_LitIsCompl(pObjNew->pFans[i]) )
        {
            pObjNew->pFans[i] = Abc_LitRegular(pObjNew->pFans[i]);
            Kit_TruthChangePhase( pTruthNew, pObjNew->nFans, i );
        }
    }
    // if the incoming phase is complemented, absorb it into the prime node
    if ( Abc_LitIsCompl(iLit) )
        Kit_TruthNot( pTruthNew, pTruthNew, pObj->nFans );
    return Abc_Var2Lit( pObjNew->Id, 0 );
}